

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(char *str_id)

{
  int *piVar1;
  ImGuiWindow *this;
  uint *puVar2;
  ImGuiID IVar3;
  int iVar4;
  uint *__dest;
  int iVar5;
  int iVar6;
  
  this = GImGui->CurrentWindow;
  IVar3 = ImGuiWindow::GetIDNoKeepAlive(this,str_id,(char *)0x0);
  iVar4 = (this->IDStack).Size;
  if (iVar4 == (this->IDStack).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
    puVar2 = (this->IDStack).Data;
    if (puVar2 != (uint *)0x0) {
      memcpy(__dest,puVar2,(long)(this->IDStack).Size << 2);
      puVar2 = (this->IDStack).Data;
      if ((puVar2 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    }
    (this->IDStack).Data = __dest;
    (this->IDStack).Capacity = iVar6;
    iVar4 = (this->IDStack).Size;
  }
  else {
    __dest = (this->IDStack).Data;
  }
  __dest[iVar4] = IVar3;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id);
    window->IDStack.push_back(id);
}